

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,false,false,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  sel_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  if (count + 0x3f < 0x40) {
    lVar16 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar16 = 0;
    uVar8 = 0;
    uVar11 = 0;
    do {
      uVar17 = uVar8;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar13 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar13 = count;
        }
LAB_014a4d83:
        if (uVar8 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar9 = uVar8 << 4 | 8;
          do {
            uVar17 = uVar8;
            if (psVar2 != (sel_t *)0x0) {
              uVar17 = (ulong)psVar2[uVar8];
            }
            lVar4 = *(long *)((long)&rdata->months + uVar9);
            lVar14 = (long)*(int *)((long)rdata + (uVar9 - 4)) + lVar4 / 86400000000;
            lVar12 = lVar14 % 0x1e;
            lVar18 = (long)*(int *)((long)rdata + (uVar9 - 8)) + lVar14 / 0x1e;
            lVar14 = *(long *)((long)&ldata->months + uVar9);
            lVar15 = (long)*(int *)((long)ldata + (uVar9 - 4)) + lVar14 / 86400000000;
            lVar5 = lVar15 % 0x1e;
            lVar15 = (long)*(int *)((long)ldata + (uVar9 - 8)) + lVar15 / 0x1e;
            uVar6 = 1;
            if (lVar18 <= lVar15) {
              if (lVar18 < lVar15) {
                uVar6 = 0;
              }
              else if (lVar12 <= lVar5) {
                uVar6 = (ulong)(lVar14 % 86400000000 < lVar4 % 86400000000 && lVar5 <= lVar12);
              }
            }
            psVar3[lVar16] = (sel_t)uVar17;
            lVar16 = uVar6 + lVar16;
            uVar8 = uVar8 + 1;
            uVar9 = uVar9 + 0x10;
            uVar17 = uVar13;
          } while (uVar13 != uVar8);
        }
      }
      else {
        uVar9 = puVar1[uVar11];
        uVar13 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar13 = count;
        }
        if (uVar9 == 0xffffffffffffffff) goto LAB_014a4d83;
        if (uVar9 == 0) {
          uVar17 = uVar13;
          if (uVar8 < uVar13) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar7 = (sel_t)uVar8;
              if (psVar2 != (sel_t *)0x0) {
                sVar7 = psVar2[uVar8];
              }
              psVar3[lVar16] = sVar7;
              lVar16 = lVar16 + 1;
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
          }
        }
        else if (uVar8 < uVar13) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          uVar10 = uVar8 << 4 | 8;
          uVar6 = 0;
          do {
            if (psVar2 == (sel_t *)0x0) {
              sVar7 = (int)uVar8 + (int)uVar6;
            }
            else {
              sVar7 = psVar2[uVar8 + uVar6];
            }
            uVar17 = 1;
            if ((uVar9 >> (uVar6 & 0x3f) & 1) != 0) {
              lVar4 = *(long *)((long)&rdata->months + uVar10);
              lVar14 = (long)*(int *)((long)rdata + (uVar10 - 4)) + lVar4 / 86400000000;
              lVar12 = lVar14 % 0x1e;
              lVar18 = (long)*(int *)((long)rdata + (uVar10 - 8)) + lVar14 / 0x1e;
              lVar14 = *(long *)((long)&ldata->months + uVar10);
              lVar15 = (long)*(int *)((long)ldata + (uVar10 - 4)) + lVar14 / 86400000000;
              lVar5 = lVar15 % 0x1e;
              lVar15 = (long)*(int *)((long)ldata + (uVar10 - 8)) + lVar15 / 0x1e;
              if (lVar18 <= lVar15) {
                if (lVar18 < lVar15) {
                  uVar17 = 0;
                }
                else if (lVar12 <= lVar5) {
                  uVar17 = (ulong)(lVar14 % 86400000000 < lVar4 % 86400000000 && lVar5 <= lVar12);
                }
              }
            }
            psVar3[lVar16] = sVar7;
            lVar16 = uVar17 + lVar16;
            uVar6 = uVar6 + 1;
            uVar10 = uVar10 + 0x10;
            uVar17 = uVar13;
          } while (uVar13 - uVar8 != uVar6);
        }
      }
      uVar8 = uVar17;
      uVar11 = uVar11 + 1;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return count - lVar16;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}